

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O0

off_t hseek(hFILE *fp,off_t offset,int whence)

{
  int iVar1;
  ssize_t sVar2;
  off_t oVar3;
  int *piVar4;
  int ret;
  off_t pos;
  off_t oStack_20;
  int whence_local;
  off_t offset_local;
  hFILE *fp_local;
  
  iVar1 = writebuffer_is_nonempty(fp);
  oStack_20 = offset;
  if (iVar1 == 0) {
    if (whence == 1) {
      oStack_20 = offset - ((long)fp->end - (long)fp->begin);
    }
  }
  else {
    sVar2 = flush_buffer(fp);
    if ((int)sVar2 < 0) {
      return (long)(int)sVar2;
    }
  }
  oVar3 = (*fp->backend->seek)(fp,oStack_20,whence);
  if (oVar3 < 0) {
    piVar4 = __errno_location();
    fp->has_errno = *piVar4;
  }
  else {
    fp->end = fp->buffer;
    fp->begin = fp->buffer;
    fp->field_0x30 = fp->field_0x30 & 0xfe;
    fp->offset = oVar3;
  }
  return oVar3;
}

Assistant:

off_t hseek(hFILE *fp, off_t offset, int whence)
{
    off_t pos;

    if (writebuffer_is_nonempty(fp)) {
        int ret = flush_buffer(fp);
        if (ret < 0) return ret;
    }
    else {
        // Convert relative offsets from being relative to the hFILE's stream
        // position (at begin) to being relative to the backend's physical
        // stream position (at end, due to the buffering read-ahead).
        if (whence == SEEK_CUR) offset -= fp->end - fp->begin;
    }

    pos = fp->backend->seek(fp, offset, whence);
    if (pos < 0) { fp->has_errno = errno; return pos; }

    // Seeking succeeded, so discard any non-empty read buffer
    fp->begin = fp->end = fp->buffer;
    fp->at_eof = 0;

    fp->offset = pos;
    return pos;
}